

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O1

void __thiscall
kj::_::
TransformPromiseNode<kj::Own<kj::AsyncIoStream>,_kj::_::Void,_kj::CaptureByMove<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++:1955:35),_kj::Own<kj::AsyncCapabilityStream>_>,_kj::_::PropagateException>
::getImpl(TransformPromiseNode<kj::Own<kj::AsyncIoStream>,_kj::_::Void,_kj::CaptureByMove<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_async_io_c__:1955:35),_kj::Own<kj::AsyncCapabilityStream>_>,_kj::_::PropagateException>
          *this,ExceptionOrValue *output)

{
  void *__src;
  AsyncIoStream *pAVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  Exception *this_00;
  ExceptionOr<kj::_::Void> depResult;
  ExceptionOr<kj::Own<kj::AsyncIoStream>_> local_5c0;
  ExceptionOrValue local_450;
  char local_2f0;
  Exception local_2e8;
  Exception local_188;
  
  local_450.exception.ptr.isSet = false;
  local_2f0 = '\0';
  TransformPromiseNodeBase::getDepResult(&this->super_TransformPromiseNodeBase,&local_450);
  uVar6 = local_450.exception.ptr.field_1.value.context.ptr.ptr;
  uVar5 = local_450.exception.ptr.field_1.value.description.content.size_;
  uVar4 = local_450.exception.ptr.field_1.value.description.content.ptr;
  uVar3 = local_450.exception.ptr.field_1.value.ownFile.content.size_;
  uVar2 = local_450.exception.ptr.field_1.value.ownFile.content.ptr;
  if (local_450.exception.ptr.isSet == true) {
    __src = (void *)((long)&local_450.exception.ptr.field_1 + 0x50);
    local_2e8.ownFile.content.ptr = local_450.exception.ptr.field_1.value.ownFile.content.ptr;
    local_2e8.ownFile.content.size_ = local_450.exception.ptr.field_1.value.ownFile.content.size_;
    local_2e8.ownFile.content.disposer =
         local_450.exception.ptr.field_1.value.ownFile.content.disposer;
    local_450.exception.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
    local_450.exception.ptr.field_1.value.ownFile.content.size_ = 0;
    local_2e8.file = local_450.exception.ptr.field_1.value.file;
    local_2e8.line = local_450.exception.ptr.field_1.value.line;
    local_2e8.type = local_450.exception.ptr.field_1.value.type;
    local_2e8.description.content.ptr =
         local_450.exception.ptr.field_1.value.description.content.ptr;
    local_2e8.description.content.size_ =
         local_450.exception.ptr.field_1.value.description.content.size_;
    local_2e8.description.content.disposer =
         local_450.exception.ptr.field_1.value.description.content.disposer;
    local_450.exception.ptr.field_1.value.description.content.ptr = (char *)0x0;
    local_450.exception.ptr.field_1.value.description.content.size_ = 0;
    local_2e8.context.ptr.disposer = local_450.exception.ptr.field_1.value.context.ptr.disposer;
    local_2e8.context.ptr.ptr = local_450.exception.ptr.field_1.value.context.ptr.ptr;
    local_450.exception.ptr.field_1.value.context.ptr.ptr = (Context *)0x0;
    memcpy(local_2e8.trace,__src,0x104);
    local_188.ownFile.content.ptr = (char *)uVar2;
    local_188.ownFile.content.size_ = uVar3;
    local_188.ownFile.content.disposer =
         local_450.exception.ptr.field_1.value.ownFile.content.disposer;
    local_2e8.ownFile.content.ptr = (char *)0x0;
    local_2e8.ownFile.content.size_ = 0;
    local_188.file = local_450.exception.ptr.field_1.value.file;
    local_188.line = local_450.exception.ptr.field_1.value.line;
    local_188.type = local_450.exception.ptr.field_1.value.type;
    local_188.description.content.ptr = (char *)uVar4;
    local_188.description.content.size_ = uVar5;
    local_188.description.content.disposer =
         local_450.exception.ptr.field_1.value.description.content.disposer;
    local_2e8.description.content.ptr = (char *)0x0;
    local_2e8.description.content.size_ = 0;
    local_188.context.ptr.disposer = local_450.exception.ptr.field_1.value.context.ptr.disposer;
    local_188.context.ptr.ptr = (Context *)uVar6;
    local_2e8.context.ptr.ptr = (Context *)0x0;
    memcpy(local_188.trace,__src,0x104);
    local_5c0.super_ExceptionOrValue.exception.ptr.isSet = true;
    local_5c0.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.ptr = (char *)uVar2
    ;
    local_5c0.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.size_ = uVar3;
    local_5c0.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.disposer =
         local_450.exception.ptr.field_1.value.ownFile.content.disposer;
    local_188.ownFile.content.ptr = (char *)0x0;
    local_188.ownFile.content.size_ = 0;
    local_5c0.super_ExceptionOrValue.exception.ptr.field_1.value.file =
         local_450.exception.ptr.field_1.value.file;
    local_5c0.super_ExceptionOrValue.exception.ptr.field_1._32_8_ =
         local_450.exception.ptr.field_1._32_8_;
    local_5c0.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.ptr =
         (char *)uVar4;
    local_5c0.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.size_ = uVar5;
    local_5c0.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.disposer =
         local_450.exception.ptr.field_1.value.description.content.disposer;
    local_188.description.content.ptr = (char *)0x0;
    local_188.description.content.size_ = 0;
    local_5c0.super_ExceptionOrValue.exception.ptr.field_1.value.context.ptr.disposer =
         local_450.exception.ptr.field_1.value.context.ptr.disposer;
    local_5c0.super_ExceptionOrValue.exception.ptr.field_1.value.context.ptr.ptr = (Context *)uVar6;
    local_188.context.ptr.ptr = (Context *)0x0;
    memcpy((void *)((long)&local_5c0.super_ExceptionOrValue.exception.ptr.field_1 + 0x50),__src,
           0x104);
    local_5c0.value.ptr.disposer = (Disposer *)0x0;
    local_5c0.value.ptr.ptr = (AsyncIoStream *)0x0;
    Exception::~Exception(&local_188);
    ExceptionOr<kj::Own<kj::AsyncIoStream>_>::operator=
              ((ExceptionOr<kj::Own<kj::AsyncIoStream>_> *)output,&local_5c0);
    pAVar1 = local_5c0.value.ptr.ptr;
    if (local_5c0.value.ptr.ptr != (AsyncIoStream *)0x0) {
      local_5c0.value.ptr.ptr = (AsyncIoStream *)0x0;
      (**(local_5c0.value.ptr.disposer)->_vptr_Disposer)
                (local_5c0.value.ptr.disposer,
                 (_func_int *)
                 ((long)&(((AsyncIoStream *)&pAVar1->super_AsyncInputStream)->super_AsyncInputStream
                         )._vptr_AsyncInputStream +
                 (long)(((AsyncIoStream *)&pAVar1->super_AsyncInputStream)->super_AsyncInputStream).
                       _vptr_AsyncInputStream[-2]));
    }
    if (local_5c0.super_ExceptionOrValue.exception.ptr.isSet == true) {
      Exception::~Exception(&local_5c0.super_ExceptionOrValue.exception.ptr.field_1.value);
    }
    this_00 = &local_2e8;
  }
  else {
    if (local_2f0 != '\x01') goto LAB_004832f1;
    local_5c0.value.ptr.disposer = (this->func).param.disposer;
    local_5c0.value.ptr.ptr = &((this->func).param.ptr)->super_AsyncIoStream;
    (this->func).param.ptr = (AsyncCapabilityStream *)0x0;
    local_5c0.super_ExceptionOrValue.exception.ptr.isSet = false;
    ExceptionOr<kj::Own<kj::AsyncIoStream>_>::operator=
              ((ExceptionOr<kj::Own<kj::AsyncIoStream>_> *)output,&local_5c0);
    pAVar1 = local_5c0.value.ptr.ptr;
    if (local_5c0.value.ptr.ptr != (AsyncIoStream *)0x0) {
      local_5c0.value.ptr.ptr = (AsyncIoStream *)0x0;
      (**(local_5c0.value.ptr.disposer)->_vptr_Disposer)
                (local_5c0.value.ptr.disposer,
                 (_func_int *)
                 ((long)&(((AsyncIoStream *)&pAVar1->super_AsyncInputStream)->super_AsyncInputStream
                         )._vptr_AsyncInputStream +
                 (long)(((AsyncIoStream *)&pAVar1->super_AsyncInputStream)->super_AsyncInputStream).
                       _vptr_AsyncInputStream[-2]));
    }
    if (local_5c0.super_ExceptionOrValue.exception.ptr.isSet != true) goto LAB_004832f1;
    this_00 = (Exception *)&local_5c0.super_ExceptionOrValue.exception.ptr.field_1;
  }
  Exception::~Exception(this_00);
LAB_004832f1:
  if (local_450.exception.ptr.isSet == true) {
    Exception::~Exception(&local_450.exception.ptr.field_1.value);
  }
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_MAYBE(depException, depResult.exception) {
      output.as<T>() = handle(
          MaybeVoidCaller<Exception, FixVoid<ReturnType<ErrorFunc, Exception>>>::apply(
              errorHandler, kj::mv(*depException)));
    } else KJ_IF_MAYBE(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(*depValue)));
    }
  }